

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O1

half Imf_2_5::floatToHalf(float f)

{
  short sVar1;
  unsigned_short uVar2;
  
  if ((0x7f7fffff < (uint)ABS(f)) ||
     ((uVar2 = 0x7c00, f <= 65504.0 && (uVar2 = 0xfc00, -65504.0 <= f)))) {
    if ((f != 0.0) || (NAN(f))) {
      sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)f >> 0x17) * 2);
      if (sVar1 == 0) {
        uVar2 = half::convert((int)f);
        return (half)uVar2;
      }
      return (half)(sVar1 + (short)(((uint)f & 0x7fffff) + 0xfff + (uint)(((uint)f >> 0xd & 1) != 0)
                                   >> 0xd));
    }
    uVar2 = (unsigned_short)((uint)f >> 0x10);
  }
  return (half)uVar2;
}

Assistant:

half	
floatToHalf (float f)
{
    if (isFinite (f))
    {
	if (f >  HALF_MAX)
	    return half::posInf();

	if (f < -HALF_MAX)
	    return half::negInf();
    }

    return half (f);
}